

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O0

void __thiscall imgtogb::StdOutput::StdOutput(StdOutput *this,string *basename,string *author)

{
  string *author_local;
  string *basename_local;
  StdOutput *this_local;
  
  TCLAP::CmdLineOutput::CmdLineOutput(&this->super_CmdLineOutput);
  (this->super_CmdLineOutput)._vptr_CmdLineOutput = (_func_int **)&PTR__StdOutput_0018f630;
  std::__cxx11::string::string((string *)&this->basename,(string *)basename);
  std::__cxx11::string::string((string *)&this->author,(string *)author);
  return;
}

Assistant:

StdOutput(const std::string &basename, const std::string &author)
			: basename(basename)
			, author(author)
			{ }